

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O1

char * do_pathnormalize(char *from,char *to)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  sys_unbashfilename(from,to);
  cVar2 = *to;
  pcVar3 = to;
  pcVar5 = to;
  while (cVar2 != '\0') {
    pcVar4 = pcVar5;
    if (cVar2 == '/') {
      do {
        pcVar5 = pcVar4 + 1;
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar5;
      } while (*pcVar1 == '/');
    }
    else {
      pcVar5 = pcVar5 + 1;
    }
    pcVar3 = pcVar3 + 1;
    cVar2 = *pcVar5;
    *pcVar3 = cVar2;
  }
  return to;
}

Assistant:

static char*do_pathnormalize(const char *from, char *to) {
    const char *rp;
    char *wp, c;
    sys_unbashfilename(from, to);
    rp=wp=to;
    while((*wp++=c=*rp++)) {
        if('/' == c) {
            while('/' == *rp++);
            rp--;
        }
    }
    return to;
}